

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxyMono.cpp
# Opt level: O0

Clause * __thiscall Shell::EqualityProxyMono::apply(EqualityProxyMono *this,Clause *cl)

{
  ConstIterator it;
  TermList key;
  undefined1 uVar1;
  TermList *pTVar2;
  size_t sVar3;
  Unit **ppUVar4;
  Clause *in_RSI;
  UnitList *prems;
  Clause *res;
  Unit *prem;
  TermList srt;
  Literal *rlit;
  Literal *lit;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  bool modified;
  RStack<Literal_*> resLits;
  UnitStack proxyPremises;
  undefined4 in_stack_fffffffffffffe08;
  uint in_stack_fffffffffffffe0c;
  uint a;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  size_t in_stack_fffffffffffffe18;
  Clause *in_stack_fffffffffffffe20;
  Literal *in_stack_fffffffffffffe30;
  EqualityProxyMono *in_stack_fffffffffffffe38;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_fffffffffffffe50;
  Inference *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  NonspecificInferenceMany local_170;
  Inference local_160;
  UnitList *local_120;
  NonspecificInference2 local_118;
  Inference local_100;
  Clause *local_d0;
  undefined4 local_c4;
  uint64_t local_c0;
  Unit *local_b8;
  uint64_t local_b0;
  Term *local_a8;
  Term *local_a0;
  undefined1 local_78 [24];
  undefined1 *local_60;
  byte local_55;
  Stack<Kernel::Unit_*> local_38;
  Clause *local_18;
  Clause *local_8;
  
  local_18 = in_RSI;
  Lib::Stack<Kernel::Unit_*>::Stack
            ((Stack<Kernel::Unit_*> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_55 = 0;
  Kernel::Clause::iterLits(in_stack_fffffffffffffe20);
  local_60 = local_78;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  while( true ) {
    uVar1 = Lib::operator!=((StlIter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10)
                            ,(StlIter *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (!(bool)uVar1) break;
    in_stack_fffffffffffffe78 =
         (Inference *)
         Lib::
         IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
         ::StlIter::operator*((StlIter *)0xb9031b);
    local_a0 = *(Term **)in_stack_fffffffffffffe78;
    local_a8 = &apply(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30)->super_Term;
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0xb90368);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)
               CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (Literal *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    if (local_a8 != local_a0) {
      local_55 = 1;
      Kernel::Term::functor(local_a8);
      pTVar2 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                         ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                           *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          in_stack_fffffffffffffe0c);
      local_c0 = pTVar2->_content;
      key._content._4_4_ = in_stack_fffffffffffffe14;
      key._content._0_4_ = in_stack_fffffffffffffe10;
      local_b0 = local_c0;
      in_stack_fffffffffffffe50 =
           (Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           Lib::DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                     ((DHMap<Kernel::TermList,_Kernel::Unit_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                       *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),key);
      local_b8 = (Unit *)(in_stack_fffffffffffffe50->_self)._M_t.
                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
      ;
      Lib::Stack<Kernel::Unit_*>::push
                ((Stack<Kernel::Unit_*> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (Unit *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  }
  if ((local_55 & 1) == 0) {
    local_8 = local_18;
  }
  else {
    sVar3 = Lib::Stack<Kernel::Unit_*>::size(&local_38);
    if (sVar3 == 1) {
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0xb904d1);
      ppUVar4 = Lib::Stack<Kernel::Unit_*>::top(&local_38);
      Kernel::NonspecificInference2::NonspecificInference2
                (&local_118,EQUALITY_PROXY_REPLACEMENT,&local_18->super_Unit,*ppUVar4);
      Kernel::Inference::Inference
                ((Inference *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (NonspecificInference2 *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_d0 = Kernel::Clause::fromStack
                           ((Stack<Kernel::Literal_*> *)CONCAT17(uVar1,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
      Kernel::Inference::~Inference(&local_100);
    }
    else {
      local_120 = (UnitList *)0x0;
      Lib::Stack<Kernel::Unit_*>::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (Stack<Kernel::Unit_*> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      it.super_ConstRefIterator._pointer._4_4_ = in_stack_fffffffffffffe0c;
      it.super_ConstRefIterator._pointer._0_4_ = in_stack_fffffffffffffe08;
      it.super_ConstRefIterator._stack._0_4_ = in_stack_fffffffffffffe10;
      it.super_ConstRefIterator._stack._4_4_ = in_stack_fffffffffffffe14;
      Lib::List<Kernel::Unit*>::pushFromIterator<Lib::Stack<Kernel::Unit*>::ConstIterator>
                (it,(List<Kernel::Unit_*> **)0xb905cf);
      Lib::List<Kernel::Unit_*>::push
                ((Unit *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (List<Kernel::Unit_*> **)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)0xb905f5);
      Kernel::NonspecificInferenceMany::NonspecificInferenceMany
                (&local_170,EQUALITY_PROXY_REPLACEMENT,local_120);
      Kernel::Inference::Inference
                ((Inference *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (NonspecificInferenceMany *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_d0 = Kernel::Clause::fromStack
                           ((Stack<Kernel::Literal_*> *)CONCAT17(uVar1,in_stack_fffffffffffffe80),
                            in_stack_fffffffffffffe78);
      Kernel::Inference::~Inference(&local_160);
    }
    a = (uint)((ulong)local_d0 >> 0x20);
    in_stack_fffffffffffffe14 = Kernel::Clause::age((Clause *)0xb906a0);
    Kernel::Clause::setAge
              ((Clause *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),a);
    local_8 = local_d0;
  }
  local_c4 = 1;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(in_stack_fffffffffffffe50);
  Lib::Stack<Kernel::Unit_*>::~Stack
            ((Stack<Kernel::Unit_*> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10))
  ;
  return local_8;
}

Assistant:

Clause* EqualityProxyMono::apply(Clause* cl)
{
  UnitStack proxyPremises;
  RStack<Literal*> resLits;

  bool modified = false;
  for (Literal* lit : cl->iterLits()) {
    Literal* rlit=apply(lit);
    resLits->push(rlit);
    if (rlit != lit) {
      ASS(lit->isEquality());
      modified = true;
      TermList srt = s_proxyPredicateSorts.get(rlit->functor());
      Unit* prem = s_proxyPremises.get(srt);
      proxyPremises.push(prem);
    }
  }
  if (!modified) {
    return cl;
  }

  Clause* res;
  ASS(proxyPremises.isNonEmpty());
  if (proxyPremises.size() == 1) {
    res = Clause::fromStack(*resLits,
        NonspecificInference2(InferenceRule::EQUALITY_PROXY_REPLACEMENT, cl, proxyPremises.top()));
  }
  else {
    UnitList* prems = 0;
    UnitList::pushFromIterator(UnitStack::ConstIterator(proxyPremises),prems);
    UnitList::push(cl,prems);

    res = Clause::fromStack(*resLits,
        NonspecificInferenceMany(InferenceRule::EQUALITY_PROXY_REPLACEMENT, prems));
  }
  // TODO isn't this done atomatically
  res->setAge(cl->age()); // MS: this seems useless; as long as EqualityProxy is only operating as a part of preprocessing, age is going to 0 anyway

  return res;
}